

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

DefaultValueObjectWriter * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::StartList
          (DefaultValueObjectWriter *this,StringPiece name)

{
  iterator *piVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Elt_pointer ppNVar5;
  Type *pTVar6;
  int iVar7;
  Node *pNVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar9;
  Node *pNVar10;
  Node **__args;
  _Any_data local_e8;
  code *local_d8;
  _Any_data local_c8;
  code *local_b8;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  undefined **local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined1 local_68;
  Node **local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [23];
  byte local_31;
  
  pcVar9 = name.ptr_;
  if (this->current_ == (Node *)0x0) {
    auStack_a8 = (undefined1  [8])0x0;
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58 = local_48;
    if (pcVar9 == (char *)0x0) {
      local_50 = 0;
      local_48[0] = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,pcVar9,pcVar9 + name.length_);
    }
    pTVar6 = this->type_;
    local_88 = &PTR__DataPiece_003bcd00;
    local_80 = 0xb;
    local_78 = 0;
    local_68 = 0;
    bVar2 = this->suppress_empty_list_;
    bVar3 = this->preserve_proto_field_names_;
    bVar4 = this->use_ints_for_enums_;
    std::
    function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
    ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                *)&local_e8,&this->field_scrub_callback_);
    iVar7 = (*(this->super_ObjectWriter)._vptr_ObjectWriter[0x11])
                      (this,&local_58,pTVar6,2,&local_88,0,auStack_a8,(ulong)bVar2,(ulong)bVar3,
                       (ulong)bVar4,&local_e8);
    pNVar8 = (this->root_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
             ._M_head_impl;
    (this->root_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
    .
    super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
    ._M_head_impl = (Node *)CONCAT44(extraout_var_00,iVar7);
    if (pNVar8 != (Node *)0x0) {
      (*pNVar8->_vptr_Node[1])();
    }
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,__destroy_functor);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
    this->current_ =
         (this->root_)._M_t.
         super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
         .
         super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
         ._M_head_impl;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_a8);
  }
  else {
    __args = &this->current_;
    MaybePopulateChildrenOfAny(this,this->current_);
    pNVar8 = Node::FindChild(this->current_,name);
    if ((pNVar8 == (Node *)0x0) || (pNVar8->kind_ != LIST)) {
      local_58 = local_48;
      local_60 = __args;
      if (pcVar9 == (char *)0x0) {
        local_50 = 0;
        local_48[0] = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,pcVar9,pcVar9 + name.length_);
      }
      local_88 = &PTR__DataPiece_003bcd00;
      local_80 = 0xb;
      local_78 = 0;
      local_68 = 0;
      pNVar10 = this->current_;
      local_31 = this->suppress_empty_list_;
      bVar2 = this->preserve_proto_field_names_;
      bVar3 = this->use_ints_for_enums_;
      std::
      function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
      ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
                  *)&local_c8,&this->field_scrub_callback_);
      if (pNVar8 != (Node *)0x0) {
        pNVar10 = pNVar8;
      }
      iVar7 = (*(this->super_ObjectWriter)._vptr_ObjectWriter[0x11])
                        (this,&local_58,0,2,&local_88,0,&pNVar10->path_,(ulong)local_31,(ulong)bVar2
                         ,(ulong)bVar3,&local_c8);
      __args = local_60;
      pNVar8 = (Node *)CONCAT44(extraout_var,iVar7);
      if (local_b8 != (code *)0x0) {
        (*local_b8)(&local_c8,&local_c8,__destroy_functor);
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      Node::AddChild(*__args,pNVar8);
    }
    pNVar8->is_placeholder_ = false;
    ppNVar5 = (this->stack_).c.
              super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppNVar5 ==
        (this->stack_).c.
        super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
      ::_M_push_back_aux<google::protobuf::util::converter::DefaultValueObjectWriter::Node*const&>
                ((deque<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                  *)&this->stack_,__args);
    }
    else {
      *ppNVar5 = this->current_;
      piVar1 = &(this->stack_).c.
                super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    *__args = pNVar8;
  }
  return this;
}

Assistant:

DefaultValueObjectWriter* DefaultValueObjectWriter::StartList(
    StringPiece name) {
  if (current_ == nullptr) {
    std::vector<std::string> path;
    root_.reset(CreateNewNode(std::string(name), &type_, LIST,
                              DataPiece::NullData(), false, path,
                              suppress_empty_list_, preserve_proto_field_names_,
                              use_ints_for_enums_, field_scrub_callback_));
    current_ = root_.get();
    return this;
  }
  MaybePopulateChildrenOfAny(current_);
  Node* child = current_->FindChild(name);
  if (child == nullptr || child->kind() != LIST) {
    std::unique_ptr<Node> node(CreateNewNode(
        std::string(name), nullptr, LIST, DataPiece::NullData(), false,
        child == nullptr ? current_->path() : child->path(),
        suppress_empty_list_, preserve_proto_field_names_, use_ints_for_enums_,
        field_scrub_callback_));
    child = node.get();
    current_->AddChild(node.release());
  }
  child->set_is_placeholder(false);

  stack_.push(current_);
  current_ = child;
  return this;
}